

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyHaig.c
# Opt level: O0

Ivy_Obj_t * Ivy_HaigObjRepr(Ivy_Obj_t *pObj)

{
  int iVar1;
  Ivy_Obj_t *local_20;
  Ivy_Obj_t *pTemp;
  Ivy_Obj_t *pObj_local;
  
  iVar1 = Ivy_IsComplement(pObj);
  if (iVar1 != 0) {
    __assert_fail("!Ivy_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyHaig.c"
                  ,0x31,"Ivy_Obj_t *Ivy_HaigObjRepr(Ivy_Obj_t *)");
  }
  pObj_local = pObj;
  if ((pObj->pEquiv != (Ivy_Obj_t *)0x0) && (iVar1 = Ivy_ObjRefs(pObj), iVar1 < 1)) {
    local_20 = Ivy_Regular(pObj->pEquiv);
    while ((local_20 != pObj && (iVar1 = Ivy_ObjRefs(local_20), iVar1 < 1))) {
      local_20 = Ivy_Regular(local_20->pEquiv);
    }
    iVar1 = Ivy_ObjRefs(local_20);
    if (iVar1 < 1) {
      __assert_fail("Ivy_ObjRefs(pTemp) > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyHaig.c"
                    ,0x3b,"Ivy_Obj_t *Ivy_HaigObjRepr(Ivy_Obj_t *)");
    }
    iVar1 = Ivy_IsComplement(pObj->pEquiv);
    pObj_local = Ivy_NotCond(local_20,iVar1);
  }
  return pObj_local;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

/* 
    HAIGing rules in working AIG:
    - Each node in the working AIG has a pointer to the corresponding node in HAIG 
      (this node is not necessarily the representative of the equivalence class of HAIG nodes)
    - This pointer is complemented if the AIG node and its corresponding HAIG node have different phase

    Choice node rules in HAIG:
    - Equivalent nodes are linked into a ring
    - Exactly one node in the ring has fanouts (this node is called the representative)
    - The pointer going from a node to the next node in the ring is complemented 
      if the first node is complemented, compared to the representative node of the equivalence class
    - (consequence of the above) The representative node always has non-complemented pointer to the next node
    - New nodes are inserted into the ring immediately after the representative node
*/

// returns the representative node of the given HAIG node
static inline Ivy_Obj_t * Ivy_HaigObjRepr( Ivy_Obj_t * pObj )
{
    Ivy_Obj_t * pTemp;
    assert( !Ivy_IsComplement(pObj) );
    // if the node has no equivalent node or has fanout, it is representative
    if ( pObj->pEquiv == NULL || Ivy_ObjRefs(pObj) > 0 )
        return pObj;
    // the node belongs to a class and is not a representative
    // complemented edge (pObj->pEquiv) tells if it is complemented w.r.t. the repr
    for ( pTemp = Ivy_Regular(pObj->pEquiv); pTemp != pObj; pTemp = Ivy_Regular(pTemp->pEquiv) )
        if ( Ivy_ObjRefs(pTemp) > 0 )
            break;
    // return the representative node
    assert( Ivy_ObjRefs(pTemp) > 0 );
    return Ivy_NotCond( pTemp, Ivy_IsComplement(pObj->pEquiv) );
}